

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O2

void __thiscall lsim::StringProperty::value(StringProperty *this,int64_t val)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,val);
  std::__cxx11::string::operator=((string *)&this->m_value,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void StringProperty::value(int64_t val) {
    m_value = std::to_string(val);   
}